

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::GetTargetCompileFlags
          (cmLocalGenerator *this,cmGeneratorTarget *target,string *config,string *lang,
          string *flags)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  string *config_00;
  bool bVar3;
  int iVar4;
  cmLocalGenerator *this_00;
  string local_58;
  string *local_38;
  
  pcVar1 = this->Makefile;
  AddLanguageFlags(this,flags,target,lang,config);
  bVar3 = cmGeneratorTarget::IsIPOEnabled(target,lang,config);
  if (bVar3) {
    AppendFeatureOptions(this,flags,lang,"IPO");
  }
  AddArchitectureFlags(this,flags,target,lang,config);
  iVar4 = std::__cxx11::string::compare((char *)lang);
  if (iVar4 == 0) {
    (*this->_vptr_cmLocalGenerator[0xd])(&local_58,this,target,config);
    (*this->_vptr_cmLocalGenerator[6])(this,flags,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  local_38 = config;
  AddCMP0018Flags(this,flags,target,lang,config);
  AddVisibilityPresetFlags(this,flags,target,lang);
  pcVar2 = (pcVar1->DefineFlags)._M_dataplus._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (pcVar1->DefineFlags)._M_string_length);
  this_00 = (cmLocalGenerator *)flags;
  (*this->_vptr_cmLocalGenerator[6])(this,flags,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    this_00 = (cmLocalGenerator *)(local_58.field_2._M_allocated_capacity + 1);
    operator_delete(local_58._M_dataplus._M_p,(ulong)this_00);
  }
  config_00 = local_38;
  GetFrameworkFlags(&local_58,this_00,lang,local_38,target);
  (*this->_vptr_cmLocalGenerator[6])(this,flags,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  AddCompileOptions(this,flags,target,lang,config_00);
  return;
}

Assistant:

void cmLocalGenerator::GetTargetCompileFlags(cmGeneratorTarget* target,
                                             std::string const& config,
                                             std::string const& lang,
                                             std::string& flags)
{
  cmMakefile* mf = this->GetMakefile();

  // Add language-specific flags.
  this->AddLanguageFlags(flags, target, lang, config);

  if (target->IsIPOEnabled(lang, config)) {
    this->AppendFeatureOptions(flags, lang, "IPO");
  }

  this->AddArchitectureFlags(flags, target, lang, config);

  if (lang == "Fortran") {
    this->AppendFlags(flags, this->GetTargetFortranFlags(target, config));
  }

  this->AddCMP0018Flags(flags, target, lang, config);
  this->AddVisibilityPresetFlags(flags, target, lang);
  this->AppendFlags(flags, mf->GetDefineFlags());
  this->AppendFlags(flags, this->GetFrameworkFlags(lang, config, target));
  this->AddCompileOptions(flags, target, lang, config);
}